

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O1

void __thiscall
PoolList<Server::Private::ListenerImpl>::clear(PoolList<Server::Private::ListenerImpl> *this)

{
  Item *pIVar1;
  
  for (pIVar1 = (this->_begin).item; pIVar1 != &this->endItem; pIVar1 = pIVar1->next) {
    Socket::~Socket((Socket *)(pIVar1 + 1));
    pIVar1->prev = this->freeItem;
    this->freeItem = pIVar1;
  }
  (this->_begin).item = &this->endItem;
  this->_size = 0;
  (this->endItem).prev = (Item *)0x0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      ((T*)(i + 1))->~T();
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }